

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyRandomnessInit(SyPRNGCtx *pCtx,ProcRandomSeed xSeed,void *pUserData)

{
  uchar uVar1;
  uint local_134;
  sxu32 i;
  sxi32 rc;
  sxu8 t;
  char zSeed [256];
  void *pUserData_local;
  ProcRandomSeed xSeed_local;
  SyPRNGCtx *pCtx_local;
  
  if (pCtx->nMagic == 0x13c4) {
    pCtx_local._4_4_ = 0;
  }
  else {
    pUserData_local = xSeed;
    if (xSeed == (ProcRandomSeed)0x0) {
      pUserData_local = SyOSUtilRandomSeed;
    }
    zSeed._248_8_ = pUserData;
    pCtx_local._4_4_ = (*(code *)pUserData_local)(&rc,0x100,pUserData);
    if (pCtx_local._4_4_ == 0) {
      pCtx->j = '\0';
      pCtx->i = '\0';
      for (local_134 = 0; local_134 < 0x100; local_134 = local_134 + 1) {
        pCtx->s[local_134] = (uchar)local_134;
      }
      for (local_134 = 0; local_134 < 0x100; local_134 = local_134 + 1) {
        pCtx->j = pCtx->j + pCtx->s[local_134] + *(char *)((long)&rc + (ulong)local_134);
        uVar1 = pCtx->s[pCtx->j];
        pCtx->s[pCtx->j] = pCtx->s[local_134];
        pCtx->s[local_134] = uVar1;
      }
      pCtx->nMagic = 0x13c4;
      pCtx_local._4_4_ = 0;
    }
  }
  return pCtx_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 SyRandomnessInit(SyPRNGCtx *pCtx, ProcRandomSeed xSeed, void * pUserData)
{
	char zSeed[256];
	sxu8 t;
	sxi32 rc;
	sxu32 i;
	if( pCtx->nMagic == SXPRNG_MAGIC ){
		return SXRET_OK; /* Already initialized */
	}
 /* Initialize the state of the random number generator once, 
  ** the first time this routine is called.The seed value does
  ** not need to contain a lot of randomness since we are not
  ** trying to do secure encryption or anything like that...
  */	
	if( xSeed == 0 ){
		xSeed = SyOSUtilRandomSeed;
	}
	rc = xSeed(zSeed, sizeof(zSeed), pUserData);
	if( rc != SXRET_OK ){
		return rc;
	}
	pCtx->i = pCtx->j = 0;
	for(i=0; i < SX_ARRAYSIZE(pCtx->s) ; i++){
		pCtx->s[i] = (unsigned char)i;
    }
    for(i=0; i < sizeof(zSeed) ; i++){
      pCtx->j += pCtx->s[i] + zSeed[i];
      t = pCtx->s[pCtx->j];
      pCtx->s[pCtx->j] = pCtx->s[i];
      pCtx->s[i] = t;
    }
	pCtx->nMagic = SXPRNG_MAGIC;
	
	return SXRET_OK;
}